

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O3

Vec_Wec_t * Gia_ManFxRetrieve(Gia_Man_t *p,Vec_Str_t **pvCompl,int fReverse)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Vec_Wrd_t *__ptr;
  Vec_Int_t *vMemory;
  int *piVar9;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar10;
  Vec_Str_t *pVVar11;
  char *__s;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  
  iVar5 = Gia_ManAssignNumbers(p);
  iVar6 = Gia_ManLutSizeMax(p);
  __ptr = Gia_ManComputeTruths(p,iVar6,iVar5 - p->vCis->nSize,fReverse);
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar9 = (int *)malloc(0x40000);
  vMemory->pArray = piVar9;
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pVVar10 = (Vec_Int_t *)calloc(1000,0x10);
  p_00->pArray = pVVar10;
  pVVar11 = (Vec_Str_t *)malloc(0x10);
  iVar17 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar17 = iVar5;
  }
  pVVar11->nCap = iVar17;
  if (iVar17 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar17);
  }
  bVar12 = (byte)(iVar6 + -6);
  pVVar11->pArray = __s;
  pVVar11->nSize = iVar5;
  memset(__s,0,(long)iVar5);
  *pvCompl = pVVar11;
  if (p->nObjs < 2) {
    if (iVar6 < 7) {
      bVar12 = 0;
    }
    iVar17 = 0;
  }
  else {
    iVar17 = 0;
    iVar5 = iVar6 + -6;
    if (iVar6 < 7) {
      iVar5 = iVar17;
    }
    lVar15 = 1;
    do {
      uVar7 = p->vMapping->nSize;
      if ((int)uVar7 <= lVar15) {
LAB_00747542:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar9 = p->vMapping->pArray;
      uVar1 = piVar9[lVar15];
      uVar16 = (ulong)uVar1;
      bVar12 = (byte)iVar5;
      if (uVar16 != 0) {
        if (((int)uVar1 < 0) || (uVar7 <= uVar1)) goto LAB_00747542;
        uVar7 = iVar17 << (bVar12 & 0x1f);
        if ((iVar17 << (bVar12 & 0x1f) < 0) || (__ptr->nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pGVar2 = p->pObjs;
        uVar1 = piVar9[uVar16];
        iVar17 = iVar17 + 1;
        iVar8 = Kit_TruthIsop((uint *)(__ptr->pArray + uVar7),uVar1,vMemory,1);
        iVar6 = vMemory->nSize;
        if ((iVar6 == 0) || ((iVar6 == 1 && (*vMemory->pArray == 0)))) {
          uVar7 = pGVar2[lVar15].Value;
          if (((long)(int)uVar7 < 0) || ((*pvCompl)->nSize <= (int)uVar7)) goto LAB_00747580;
          (*pvCompl)->pArray[(int)uVar7] = iVar6 == 0;
          pVVar10 = Vec_WecPushLevel(p_00);
          Vec_IntPush(pVVar10,pGVar2[lVar15].Value);
        }
        else {
          uVar7 = pGVar2[lVar15].Value;
          if (((long)(int)uVar7 < 0) || ((*pvCompl)->nSize <= (int)uVar7)) {
LAB_00747580:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
          }
          (*pvCompl)->pArray[(int)uVar7] = (char)iVar8;
          if (0 < vMemory->nSize) {
            lVar4 = uVar16 * 4 + 4;
            lVar13 = 0;
            do {
              iVar6 = vMemory->pArray[lVar13];
              pVVar10 = Vec_WecPushLevel(p_00);
              Vec_IntPush(pVVar10,pGVar2[lVar15].Value);
              if (0 < (int)uVar1) {
                lVar20 = 0;
                do {
                  switch(iVar6 >> ((byte)lVar20 & 0x1f) & 3) {
                  case 0:
                    goto switchD_00747318_caseD_0;
                  case 1:
                    iVar8 = *(int *)((long)piVar9 + lVar20 * 2 + lVar4);
                    if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_007474e5:
                      __assert_fail("v >= 0 && v < p->nObjs",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                    }
                    uVar7 = p->pObjs[iVar8].Value;
                    if ((int)uVar7 < 0) {
LAB_00747504:
                      __assert_fail("Var >= 0 && !(c >> 1)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                    ,0x12e,"int Abc_Var2Lit(int, int)");
                    }
                    iVar8 = uVar7 * 2 + 1;
                    break;
                  case 2:
                    iVar8 = *(int *)((long)piVar9 + lVar20 * 2 + lVar4);
                    if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_007474e5;
                    uVar7 = p->pObjs[iVar8].Value;
                    if ((int)uVar7 < 0) goto LAB_00747504;
                    iVar8 = uVar7 * 2;
                    break;
                  case 3:
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                                  ,0xea,
                                  "Vec_Wec_t *Gia_ManFxRetrieve(Gia_Man_t *, Vec_Str_t **, int)");
                  }
                  Vec_IntPush(pVVar10,iVar8);
switchD_00747318_caseD_0:
                  lVar20 = lVar20 + 2;
                } while ((ulong)uVar1 * 2 != lVar20);
              }
              iVar6 = pVVar10->nSize;
              if (2 < iVar6) {
                piVar3 = pVVar10->pArray;
                uVar14 = 1;
                uVar16 = 0;
                do {
                  uVar19 = uVar16 & 0xffffffff;
                  uVar18 = uVar14;
                  do {
                    uVar7 = (uint)uVar18;
                    if (piVar3[(long)(int)(uint)uVar19 + 1] <= piVar3[uVar18 + 1]) {
                      uVar7 = (uint)uVar19;
                    }
                    uVar18 = uVar18 + 1;
                    uVar19 = (ulong)uVar7;
                  } while (iVar6 - 1 != uVar18);
                  iVar8 = piVar3[uVar16 + 1];
                  piVar3[uVar16 + 1] = piVar3[(long)(int)uVar7 + 1];
                  uVar16 = uVar16 + 1;
                  piVar3[(long)(int)uVar7 + 1] = iVar8;
                  uVar14 = uVar14 + 1;
                } while (uVar16 != iVar6 - 2);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < vMemory->nSize);
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < p->nObjs);
  }
  if (iVar17 << (bVar12 & 0x1f) != __ptr->nSize) {
    __assert_fail("Counter * nWords == Vec_WrdSize(vTruths)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                  ,0xef,"Vec_Wec_t *Gia_ManFxRetrieve(Gia_Man_t *, Vec_Str_t **, int)");
  }
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
  }
  free(vMemory);
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_ManFxRetrieve( Gia_Man_t * p, Vec_Str_t ** pvCompl, int fReverse )
{
    Vec_Wec_t * vCubes;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vCube, * vCover;
    int nItems, nCutSize, nWords;
    int i, c, v, Lit, Cube, Counter = 0;
//    abctime clk = Abc_Clock();
    nItems = Gia_ManAssignNumbers( p );
    // compute truth tables
    nCutSize = Gia_ManLutSizeMax( p );
    nWords = Abc_Truth6WordNum( nCutSize );
    vTruths = Gia_ManComputeTruths( p, nCutSize, nItems - Gia_ManCiNum(p), fReverse );
    vCover = Vec_IntAlloc( 1 << 16 );
    // collect cubes
    vCubes = Vec_WecAlloc( 1000 );
    *pvCompl = Vec_StrStart( nItems );
    Gia_ManForEachLut( p, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, i );
        int nVars = Gia_ObjLutSize( p, i );
        int * pVars = Gia_ObjLutFanins( p, i );
        word * pTruth = Vec_WrdEntryP( vTruths, Counter++ * nWords );
        int Status = Kit_TruthIsop( (unsigned *)pTruth, nVars, vCover, 1 );
        if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
        {
            Vec_StrWriteEntry( *pvCompl, pObj->Value, (char)(Vec_IntSize(vCover) == 0) );
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, pObj->Value );
            continue;
        }
        Vec_StrWriteEntry( *pvCompl, pObj->Value, (char)Status );
        Vec_IntForEachEntry( vCover, Cube, c )
        {
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, pObj->Value );
            for ( v = 0; v < nVars; v++ )
            {
                Lit = 3 & (Cube >> (v << 1));
                if ( Lit == 1 )
                    Vec_IntPush( vCube, Abc_Var2Lit(Gia_ManObj(p, pVars[v])->Value, 1) );
                else if ( Lit == 2 )
                    Vec_IntPush( vCube, Abc_Var2Lit(Gia_ManObj(p, pVars[v])->Value, 0) );
                else if ( Lit != 0 )
                    assert( 0 );
            }
            Vec_IntSelectSort( Vec_IntArray(vCube) + 1, Vec_IntSize(vCube) - 1 );
        }        
    }
    assert( Counter * nWords == Vec_WrdSize(vTruths) );
    Vec_WrdFree( vTruths );
    Vec_IntFree( vCover );
//    Abc_PrintTime( 1, "Setup time", Abc_Clock() - clk );
    return vCubes;
}